

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmParser.cpp
# Opt level: O2

bool __thiscall
ArmParser::parseThumbParameters
          (ArmParser *this,Parser *parser,tThumbOpcode *opcode,ThumbOpcodeVariables *vars)

{
  char *pcVar1;
  char cVar2;
  char symbol;
  bool bVar3;
  Token *pTVar4;
  ulong uVar5;
  ArmParser *this_00;
  char *pcVar6;
  ArmRegisterValue tempRegister;
  
  tempRegister.name._name._M_dataplus._M_p = (pointer)&tempRegister.name._name.field_2;
  tempRegister.name._name.field_2._M_allocated_capacity = 0;
  tempRegister.name._name.field_2._8_8_ = 0;
  tempRegister.name._name._M_string_length = 0;
  this_00 = this;
  pcVar6 = opcode->mask;
LAB_001548a2:
  cVar2 = *pcVar6;
  if (cVar2 == '\0') {
    pTVar4 = Parser::nextToken(parser);
    bVar3 = pTVar4->type == Separator;
    goto LAB_00154a26;
  }
  uVar5 = (ulong)(cVar2 == '/');
  symbol = (pcVar6 + uVar5 + 1)[-1];
  switch(symbol) {
  case 'i':
switchD_0015490c_caseD_69:
    this_00 = this;
    bVar3 = parseImmediate(this,parser,&vars->ImmediateExpression);
    if (!bVar3) goto LAB_00154a13;
    pcVar1 = pcVar6 + uVar5 + 1;
    pcVar6 = pcVar6 + uVar5 + 2;
    vars->ImmediateBitLen = (int)*pcVar1;
    goto LAB_001548a2;
  case 'j':
  case 'k':
  case 'l':
  case 'm':
  case 'p':
  case 'q':
switchD_0015490c_caseD_6a:
    bVar3 = matchSymbol(this_00,parser,symbol,cVar2 == '/');
    break;
  case 'n':
    bVar3 = parseRegister(this_00,parser,&vars->rn,7);
    break;
  case 'o':
    bVar3 = parseRegister(this_00,parser,&vars->ro,7);
    break;
  case 'r':
    goto switchD_0015490c_caseD_72;
  case 's':
    bVar3 = parseRegister(this_00,parser,&vars->rs,7);
    break;
  default:
    if (symbol == 'D') {
      bVar3 = parseRegister(this_00,parser,&vars->rd,0xf);
    }
    else {
      if (symbol == 'I') goto switchD_0015490c_caseD_69;
      if (symbol == 'R') {
        bVar3 = parseRegisterList(this_00,parser,&vars->rlist,
                                  (int)pcVar6[uVar5 + 2] << 8 | (int)pcVar6[uVar5 + 1]);
        if (!bVar3) goto LAB_00154a13;
        pcVar6 = pcVar6 + uVar5 + 3;
        goto LAB_001548a2;
      }
      if (symbol == 'S') {
        bVar3 = parseRegister(this_00,parser,&vars->rs,0xf);
      }
      else {
        if (symbol != 'd') goto switchD_0015490c_caseD_6a;
        bVar3 = parseRegister(this_00,parser,&vars->rd,7);
      }
    }
  }
  pcVar6 = pcVar6 + uVar5 + 1;
  if (bVar3 == false) {
LAB_00154a13:
    bVar3 = false;
LAB_00154a26:
    std::__cxx11::string::~string((string *)&tempRegister);
    return bVar3;
  }
  goto LAB_001548a2;
switchD_0015490c_caseD_72:
  bVar3 = parseRegister(this_00,parser,&tempRegister,0xf);
  if ((!bVar3) ||
     (pcVar1 = pcVar6 + uVar5 + 1, pcVar6 = pcVar6 + uVar5 + 2, tempRegister.num != *pcVar1))
  goto LAB_00154a13;
  goto LAB_001548a2;
}

Assistant:

bool ArmParser::parseThumbParameters(Parser& parser, const tThumbOpcode& opcode, ThumbOpcodeVariables& vars)
{
	const char* encoding = opcode.mask;

	ArmRegisterValue tempRegister;
	int value;

	while (*encoding != 0)
	{
		bool optional = *encoding == '/';
		if (optional)
			encoding++;

		switch (*encoding++)
		{
		case 'd': // register
			CHECK(parseRegister(parser,vars.rd,7));
			break;
		case 's': // register
			CHECK(parseRegister(parser,vars.rs,7));
			break;
		case 'n': // register
			CHECK(parseRegister(parser,vars.rn,7));
			break;
		case 'o': // register
			CHECK(parseRegister(parser,vars.ro,7));
			break;
		case 'D': // register
			CHECK(parseRegister(parser,vars.rd,15));
			break;
		case 'S': // register
			CHECK(parseRegister(parser,vars.rs,15));
			break;
		case 'r': // forced register
			CHECK(parseRegister(parser,tempRegister,15));
			CHECK(*encoding++ == tempRegister.num);
			break;
		case 'R':	// register list
			value = encoding[0] | (encoding[1] << 8);
			CHECK(parseRegisterList(parser,vars.rlist,value));
			encoding += 2;
			break;
		case 'I':	// immediate
		case 'i':
			CHECK(parseImmediate(parser,vars.ImmediateExpression));
			vars.ImmediateBitLen = *encoding++;
			break;
		default:
			CHECK(matchSymbol(parser,*(encoding-1),optional));
			break;
		}
	}
	
	// the next token has to be a separator, else the parameters aren't
	// completely parsed
	return parser.nextToken().type == TokenType::Separator;
}